

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.cc
# Opt level: O2

void __thiscall
bloaty::ReadDWARFCompileUnits
          (bloaty *this,File *file,DualMap *symbol_map,CU *skeleton,RangeSink *sink)

{
  string_view file_range;
  bool bVar1;
  mapped_type *this_00;
  string_view name;
  string_view section;
  string_view section_00;
  undefined1 *local_2b8;
  undefined8 local_2b0;
  undefined1 local_2a8;
  undefined7 uStack_2a7;
  undefined8 uStack_2a0;
  uint64_t local_298;
  File *local_290;
  CU *local_288;
  File *local_280;
  undefined1 *local_278;
  undefined8 local_270;
  undefined1 local_268;
  undefined7 uStack_267;
  undefined8 uStack_260;
  string local_258;
  InfoReader reader;
  __node_base_ptr *local_1b8;
  size_type local_1b0;
  __node_base local_1a8;
  size_type sStack_1a0;
  float local_198;
  size_t local_190;
  __node_base_ptr p_Stack_188;
  string local_180 [32];
  AddressRanges ranges;
  CUIter iter;
  CU local_e8;
  
  if (*(long *)(this + 0x30) != 0) {
    if (*(long *)(this + 0x20) != 0) {
      reader.stmt_list_map_._M_h._M_buckets = &reader.stmt_list_map_._M_h._M_single_bucket;
      reader.skeleton_ = (CU *)0x0;
      reader.stmt_list_map_._M_h._M_bucket_count = 1;
      reader.stmt_list_map_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      reader.stmt_list_map_._M_h._M_element_count = 0;
      reader.stmt_list_map_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      reader.stmt_list_map_._M_h._M_rehash_policy._M_next_resize = 0;
      reader.stmt_list_map_._M_h._M_single_bucket = (__node_base_ptr)0x0;
      reader.abbrev_tables_._M_h._M_buckets = &reader.abbrev_tables_._M_h._M_single_bucket;
      reader.abbrev_tables_._M_h._M_bucket_count = 1;
      reader.abbrev_tables_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      reader.abbrev_tables_._M_h._M_element_count = 0;
      reader.abbrev_tables_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      reader.abbrev_tables_._M_h._M_rehash_policy._M_next_resize = 0;
      reader.abbrev_tables_._M_h._M_single_bucket = (__node_base_ptr)0x0;
      local_1b8 = &p_Stack_188;
      local_1b0 = 1;
      local_1a8._M_nxt = (_Hash_node_base *)0x0;
      sStack_1a0 = 0;
      local_198 = 1.0;
      local_190 = 0;
      p_Stack_188 = (__node_base_ptr)0x0;
      local_288 = (CU *)symbol_map;
      local_280 = file;
      reader.dwarf_ = (File *)this;
      std::__cxx11::string::string<std::allocator<char>>
                (local_180,"[DWARF is missing filename]",(allocator<char> *)&local_e8);
      ranges.section_._M_len = *(size_t *)(this + 0x20);
      ranges.section_._M_str = *(char **)(this + 0x28);
      ranges.data_._M_len = 0;
      ranges.data_._M_str = (char *)0x0;
      ranges.unit_remaining_._M_len = 0;
      ranges.unit_remaining_._M_str = (char *)0x0;
      local_290 = (File *)this;
      ranges.next_unit_._M_len = ranges.section_._M_len;
      ranges.next_unit_._M_str = ranges.section_._M_str;
      while( true ) {
        bVar1 = dwarf::AddressRanges::NextUnit(&ranges);
        if (!bVar1) break;
        local_298 = ranges.debug_info_offset_;
        this_00 = std::__detail::
                  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&local_1b8,&local_298);
        if (this_00->_M_string_length == 0) {
          local_2b8 = &local_2a8;
          local_2b0 = 0;
          local_2a8 = 0;
          dwarf::InfoReader::GetCUIter(&iter,&reader,kDebugInfo,local_298);
          local_e8.data_._M_len = 0;
          local_e8.data_._M_str = (char *)0x0;
          local_e8.entire_unit_._M_len = 0;
          local_e8.entire_unit_._M_str = (char *)0x0;
          local_e8.unit_name_._M_dataplus._M_p = (pointer)&local_e8.unit_name_.field_2;
          local_e8.unit_name_._M_string_length = 0;
          local_e8.unit_name_.field_2._M_local_buf[0] = '\0';
          local_e8.strp_callback_.super__Function_base._M_functor._8_8_ = 0;
          local_e8.strp_callback_.super__Function_base._M_manager = (_Manager_type)0x0;
          local_e8.range_lists_base_ = 0;
          local_e8.strp_callback_.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
          local_e8.addr_base_ = 0;
          local_e8.str_offsets_base_ = 0;
          local_e8.strp_callback_._M_invoker = (_Invoker_type)0x0;
          bVar1 = dwarf::CUIter::NextCU(&iter,&reader,&local_e8);
          if (bVar1) {
            std::__cxx11::string::_M_assign((string *)&local_2b8);
            dwarf::CU::~CU(&local_e8);
            local_278 = &local_268;
            if (local_2b8 == &local_2a8) {
              uStack_260 = uStack_2a0;
            }
            else {
              local_278 = local_2b8;
            }
            _local_268 = CONCAT71(uStack_2a7,local_2a8);
            local_270 = local_2b0;
            local_2b0 = 0;
            local_2a8 = 0;
            local_2b8 = &local_2a8;
          }
          else {
            dwarf::CU::~CU(&local_e8);
            std::__cxx11::string::string((string *)&local_278,local_180);
          }
          std::__cxx11::string::~string((string *)&local_2b8);
          std::__cxx11::string::operator=((string *)this_00,(string *)&local_278);
          std::__cxx11::string::~string((string *)&local_278);
        }
        std::__cxx11::string::string((string *)&local_258,(string *)this_00);
        while( true ) {
          bVar1 = dwarf::AddressRanges::NextRange(&ranges);
          if (!bVar1) break;
          bVar1 = dwarf::IsValidDwarfAddress(ranges.address_,ranges.sizes_.addr8_ * '\x04' + '\x04')
          ;
          if (bVar1) {
            RangeSink::AddVMRangeIgnoreDuplicate
                      ((RangeSink *)skeleton,"dwarf_aranges",ranges.address_,ranges.length_,
                       &local_258);
          }
          file_range._M_str = ranges.data_._M_str;
          file_range._M_len = ranges.data_._M_len;
          name._M_str = local_258._M_dataplus._M_p;
          name._M_len = local_258._M_string_length;
          sink = (RangeSink *)ranges.data_._M_len;
          RangeSink::AddFileRange((RangeSink *)skeleton,"dwarf_aranges_data",name,file_range);
        }
        std::__cxx11::string::~string((string *)&local_258);
      }
      anon_func::FilenameMap::~FilenameMap((FilenameMap *)&reader);
      symbol_map = (DualMap *)local_288;
      this = (bloaty *)local_290;
      file = local_280;
    }
    reader.stmt_list_map_._M_h._M_buckets = &reader.stmt_list_map_._M_h._M_single_bucket;
    reader.stmt_list_map_._M_h._M_bucket_count = 1;
    reader.stmt_list_map_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    reader.stmt_list_map_._M_h._M_element_count = 0;
    reader.stmt_list_map_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    reader.stmt_list_map_._M_h._M_rehash_policy._M_next_resize = 0;
    reader.stmt_list_map_._M_h._M_single_bucket = (__node_base_ptr)0x0;
    reader.abbrev_tables_._M_h._M_buckets = &reader.abbrev_tables_._M_h._M_single_bucket;
    reader.abbrev_tables_._M_h._M_bucket_count = 1;
    reader.abbrev_tables_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    reader.abbrev_tables_._M_h._M_element_count = 0;
    reader.abbrev_tables_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    reader.abbrev_tables_._M_h._M_rehash_policy._M_next_resize = 0;
    reader.abbrev_tables_._M_h._M_single_bucket = (__node_base_ptr)0x0;
    reader.dwarf_ = (File *)this;
    reader.skeleton_ = (CU *)symbol_map;
    ReadDWARFDebugInfo((bloaty *)&reader,(InfoReader *)0x0,(Section)file,(DualMap *)skeleton,sink);
    ReadDWARFDebugInfo((bloaty *)&reader,(InfoReader *)0x1,(Section)file,(DualMap *)skeleton,sink);
    section._M_str = (char *)skeleton;
    section._M_len = (size_t)(((File *)this)->debug_pubnames)._M_str;
    ReadDWARFPubNames((bloaty *)&reader,(InfoReader *)(((File *)this)->debug_pubnames)._M_len,
                      section,sink);
    section_00._M_str = (char *)skeleton;
    section_00._M_len = (size_t)(((File *)this)->debug_pubtypes)._M_str;
    ReadDWARFPubNames((bloaty *)&reader,(InfoReader *)(((File *)this)->debug_pubtypes)._M_len,
                      section_00,sink);
    dwarf::InfoReader::~InfoReader(&reader);
    return;
  }
  Throw("missing debug info",0x294);
}

Assistant:

void ReadDWARFCompileUnits(const dwarf::File& file, const DualMap& symbol_map,
                           const dwarf::CU* skeleton, RangeSink* sink) {
  if (!file.debug_info.size()) {
    THROW("missing debug info");
  }

  if (file.debug_aranges.size()) {
    ReadDWARFAddressRanges(file, sink);
  }

  // Share a reader to avoid re-parsing debug abbreviations.
  dwarf::InfoReader reader(file, skeleton);

  ReadDWARFDebugInfo(reader, dwarf::InfoReader::Section::kDebugInfo, symbol_map,
                     sink);
  ReadDWARFDebugInfo(reader, dwarf::InfoReader::Section::kDebugTypes,
                     symbol_map, sink);
  ReadDWARFPubNames(reader, file.debug_pubnames, sink);
  ReadDWARFPubNames(reader, file.debug_pubtypes, sink);
}